

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeErrorConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  DynamicObject **ppDVar2;
  Var pvVar3;
  PropertyString *value;
  ScriptConfiguration *this_01;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *constructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,4,0);
  this = RecyclableObject::GetScriptContext(&constructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&constructor->super_RecyclableObject);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).errorPrototype);
  AddMember(this_00,constructor,0x124,*ppDVar2,'\0');
  pvVar3 = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,constructor,0xd1,pvVar3,'\x02');
  value = ScriptContext::GetPropertyString(this,0x7f);
  AddMember(this_00,constructor,0x106,value,'\x02');
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsErrorStackTraceEnabled(this_01);
  if (bVar1) {
    pvVar3 = JavascriptNumber::ToVar(10,this);
    AddMember(this_00,constructor,0x162,pvVar3,'\a');
  }
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeErrorConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 4);

        ScriptContext* scriptContext = constructor->GetScriptContext();
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::prototype, library->errorPrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Error), PropertyConfigurable);

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled())
        {
            library->AddMember(constructor, PropertyIds::stackTraceLimit, JavascriptNumber::ToVar(JavascriptExceptionOperators::DefaultStackTraceLimit, scriptContext), PropertyConfigurable | PropertyWritable | PropertyEnumerable);
        }

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }